

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O1

void __thiscall
webfront::log::
debug<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::debug(debug<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *this,string_view fmt,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
       basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,srcLoc *l)

{
  double __x;
  string local_30;
  
  if (logTypeEnabled._4_1_ == '\x01') {
    std::format<std::__cxx11::string&,std::__cxx11::string&>(&local_30,fmt,ts,ts_1);
    anon_unknown_4::log(__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

debug(string_view fmt, Ts&&... ts, const srcLoc& l = srcLoc::current()) {
    if (is(Debug)) log(Debug, fmt, l, std::forward<Ts>(ts)...);
    }